

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O2

void __thiscall RleTaskScheduler::RleTaskScheduler(RleTaskScheduler *this)

{
  uint uVar1;
  uint n;
  anon_class_16_2_d7082a27_for__M_head_impl local_30;
  
  uVar1 = std::thread::hardware_concurrency();
  this->_count = uVar1;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
  ::vector(&this->_q,(ulong)uVar1,(allocator_type *)&local_30);
  (this->_index).super___atomic_base<unsigned_int>._M_i = 0;
  for (uVar1 = 0; uVar1 != this->_count; uVar1 = uVar1 + 1) {
    local_30.n = uVar1;
    local_30.this = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<RleTaskScheduler::RleTaskScheduler()::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->_threads,&local_30);
  }
  IsRunning = true;
  return;
}

Assistant:

RleTaskScheduler()
    {
        for (unsigned n = 0; n != _count; ++n) {
            _threads.emplace_back([&, n] { run(n); });
        }

        IsRunning = true;
    }